

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O0

xmlRegStatePtr xmlRegStatePush(xmlRegParserCtxtPtr ctxt)

{
  int iVar1;
  xmlRegStatePtr *ppxVar2;
  int newSize;
  xmlRegStatePtr *tmp;
  xmlRegStatePtr state;
  xmlRegParserCtxtPtr ctxt_local;
  
  if (ctxt->maxStates <= ctxt->nbStates) {
    iVar1 = xmlGrowCapacity(ctxt->maxStates,8,4,1000000000);
    if (iVar1 < 0) {
      xmlRegexpErrMemory(ctxt);
      return (xmlRegStatePtr)0x0;
    }
    ppxVar2 = (xmlRegStatePtr *)(*xmlRealloc)(ctxt->states,(long)iVar1 << 3);
    if (ppxVar2 == (xmlRegStatePtr *)0x0) {
      xmlRegexpErrMemory(ctxt);
      return (xmlRegStatePtr)0x0;
    }
    ctxt->states = ppxVar2;
    ctxt->maxStates = iVar1;
  }
  ctxt_local = (xmlRegParserCtxtPtr)xmlRegNewState(ctxt);
  if (ctxt_local == (xmlRegParserCtxtPtr)0x0) {
    ctxt_local = (xmlRegParserCtxtPtr)0x0;
  }
  else {
    ctxt_local->error = ctxt->nbStates;
    iVar1 = ctxt->nbStates;
    ctxt->nbStates = iVar1 + 1;
    ctxt->states[iVar1] = (xmlRegStatePtr)ctxt_local;
  }
  return (xmlRegStatePtr)ctxt_local;
}

Assistant:

static xmlRegStatePtr
xmlRegStatePush(xmlRegParserCtxtPtr ctxt) {
    xmlRegStatePtr state;

    if (ctxt->nbStates >= ctxt->maxStates) {
	xmlRegStatePtr *tmp;
        int newSize;

        newSize = xmlGrowCapacity(ctxt->maxStates, sizeof(tmp[0]),
                                  4, XML_MAX_ITEMS);
	if (newSize < 0) {
	    xmlRegexpErrMemory(ctxt);
	    return(NULL);
	}
	tmp = xmlRealloc(ctxt->states, newSize * sizeof(tmp[0]));
	if (tmp == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    return(NULL);
	}
	ctxt->states = tmp;
	ctxt->maxStates = newSize;
    }

    state = xmlRegNewState(ctxt);
    if (state == NULL)
        return(NULL);

    state->no = ctxt->nbStates;
    ctxt->states[ctxt->nbStates++] = state;

    return(state);
}